

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::serialize(Scope<hgdb::json::VarStmt> *this,JSONWriter *w)

{
  basic_string_view<char,_std::char_traits<char>_> value;
  bool bVar1;
  int iVar2;
  JSONWriter *pJVar3;
  undefined4 extraout_var;
  ulong uVar4;
  uint *puVar5;
  vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  *this_00;
  reference this_01;
  pointer pSVar6;
  char *extraout_RDX;
  unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *scope;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  *__range4;
  byte local_c9;
  undefined1 local_c8 [7];
  bool has_scope;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string_view local_48;
  size_t local_38;
  string_view local_28;
  JSONWriter *local_18;
  JSONWriter *w_local;
  Scope<hgdb::json::VarStmt> *this_local;
  
  local_18 = w;
  w_local = (JSONWriter *)this;
  pJVar3 = JSONWriter::begin_obj(w);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"type");
  pJVar3 = JSONWriter::key(pJVar3,local_28);
  iVar2 = (*(this->super_ScopeBase)._vptr_ScopeBase[3])();
  local_38 = CONCAT44(extraout_var,iVar2);
  value._M_str = extraout_RDX;
  value._M_len = local_38;
  JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>(pJVar3,value);
  uVar4 = std::__cxx11::string::empty();
  pJVar3 = local_18;
  if ((uVar4 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"filename");
    pJVar3 = JSONWriter::key(pJVar3,local_48);
    std::__cxx11::string::string((string *)&local_68,(string *)&this->filename);
    JSONWriter::value<std::__cxx11::string>(pJVar3,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->line_num);
  pJVar3 = local_18;
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_88,"line");
    pJVar3 = JSONWriter::key(pJVar3,local_88[0]);
    puVar5 = std::optional<unsigned_int>::operator*(&this->line_num);
    JSONWriter::value<unsigned_int>(pJVar3,*puVar5);
    pJVar3 = local_18;
    if (this->column_num != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"column");
      pJVar3 = JSONWriter::key(pJVar3,local_98);
      JSONWriter::value<unsigned_int>(pJVar3,this->column_num);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  pJVar3 = local_18;
  if ((uVar4 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"condition");
    pJVar3 = JSONWriter::key(pJVar3,local_a8);
    std::__cxx11::string::string((string *)local_c8,(string *)&this->condition);
    JSONWriter::value<std::__cxx11::string>
              (pJVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8)
    ;
    std::__cxx11::string::~string((string *)local_c8);
  }
  bVar1 = std::
          vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
          ::empty(&(this->super_ScopeBase).scopes_);
  pJVar3 = local_18;
  local_c9 = (bVar1 ^ 0xffU) & 1;
  if (local_c9 != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range4,"scope");
    pJVar3 = JSONWriter::key(pJVar3,___range4);
    JSONWriter::begin_array(pJVar3);
    this_00 = &(this->super_ScopeBase).scopes_;
    __end0 = std::
             vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
             ::begin(this_00);
    scope = (unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *)
            std::
            vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
            ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
                                       *)&scope), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
                ::operator*(&__end0);
      pSVar6 = std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>::
               operator->(this_01);
      (**pSVar6->_vptr_ScopeBase)(pSVar6,local_18);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
      ::operator++(&__end0);
    }
    JSONWriter::end_array(local_18);
  }
  (*(this->super_ScopeBase)._vptr_ScopeBase[5])(this,local_18);
  JSONWriter::end_obj(local_18);
  return;
}

Assistant:

void serialize(JSONWriter &w) const override {
        w.begin_obj().key("type").value(type());
        if (!filename.empty()) {
            w.key("filename").value(filename);
        }
        if (line_num) {
            w.key("line").value(*line_num);
            if (column_num != 0) {
                w.key("column").value(column_num);
            }
        }
        if (!condition.empty()) {
            w.key("condition").value(condition);
        }

        bool has_scope = !scopes_.empty();
        if constexpr (std::is_same_v<C, Module>) {
            has_scope = true;
        }

        if (has_scope) {
            w.key("scope").begin_array();
            for (auto const &scope : scopes_) {
                scope->serialize(w);
            }
            w.end_array();
        }

        serialize_(w);

        w.end_obj();
    }